

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool slang::ast::translateUnionMembers
               (ConstantValue *result,Type *targetType,RecursiveStructMemberIterator *rsmi)

{
  bool bVar1;
  UnpackedStructType *pUVar2;
  ConstantValue *this;
  Type *in_RDX;
  ConstantValue *in_RSI;
  ConstantValue *val;
  FieldSymbol *field;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3;
  size_t i;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffb0;
  RecursiveStructMemberIterator *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_38;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *local_30;
  RecursiveStructMemberIterator *rsmi_00;
  bool local_1;
  
  bVar1 = Type::isUnpackedStruct((Type *)0xa3aded);
  if (bVar1) {
    rsmi_00 = (RecursiveStructMemberIterator *)0x0;
    pUVar2 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0xa3ae09);
    local_30 = &pUVar2->fields;
    local_38._M_current =
         (FieldSymbol **)
         std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffffa8);
    std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
               in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
      ::operator*(&local_38);
      rsmi_00 = (RecursiveStructMemberIterator *)((long)&(rsmi_00->curr).val + 1);
      in_stack_ffffffffffffffa8 =
           (span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
           slang::ConstantValue::at
                     ((ConstantValue *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      ValueSymbol::getType((ValueSymbol *)0xa3ae84);
      Type::getCanonicalType(in_stack_ffffffffffffffb0);
      bVar1 = translateUnionMembers(in_RSI,in_RDX,rsmi_00);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
      ::operator++(&local_38);
    }
    local_1 = true;
  }
  else {
    this = RecursiveStructMemberIterator::tryConsume
                     (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (this == (ConstantValue *)0x0) {
      local_1 = false;
    }
    else {
      slang::ConstantValue::operator=(this,(ConstantValue *)in_stack_ffffffffffffffa8);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool translateUnionMembers(ConstantValue& result, const Type& targetType,
                                  RecursiveStructMemberIterator& rsmi) {
    // If the target type is still an unpacked struct then recurse deeper until we
    // reach a non-struct member that can be assigned a value.
    if (targetType.isUnpackedStruct()) {
        size_t i = 0;
        for (auto field : targetType.as<UnpackedStructType>().fields) {
            if (!translateUnionMembers(result.at(i++), field->getType().getCanonicalType(), rsmi)) {
                return false;
            }
        }
        return true;
    }

    auto val = rsmi.tryConsume(targetType);
    if (val) {
        result = *val;
        return true;
    }

    return false;
}